

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O3

ssize_t __thiscall
crnlib::cfile_stream::read(cfile_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  
  uVar4 = 0;
  if (((((this->super_data_stream).field_0x1a & 1) != 0) && ((int)__buf != 0)) &&
     (((this->super_data_stream).m_attribs & 1) != 0)) {
    iVar2 = (*(this->super_data_stream)._vptr_data_stream[10])(this);
    uVar4 = CONCAT44(extraout_var,iVar2);
    if (((ulong)__buf & 0xffffffff) < CONCAT44(extraout_var,iVar2)) {
      uVar4 = (ulong)__buf & 0xffffffff;
    }
    sVar3 = fread((void *)CONCAT44(in_register_00000034,__fd),1,uVar4,(FILE *)this->m_pFile);
    if (sVar3 == uVar4) {
      this->m_ofs = this->m_ofs + uVar4;
      uVar4 = uVar4 & 0xffffffff;
    }
    else {
      puVar1 = &(this->super_data_stream).field_0x1a;
      *puVar1 = *puVar1 | 2;
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

virtual uint read(void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if (!m_opened || (!is_readable()) || (!len))
            {
                return 0;
            }

            len = static_cast<uint>(math::minimum<uint64>(len, get_remaining()));

            if (fread(pBuf, 1, len, m_pFile) != len)
            {
                set_error();
                return 0;
            }

            m_ofs += len;
            return len;
        }